

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O0

uint32_t address_space_ldub_cached_slow_mips64el
                   (uc_struct_conflict7 *uc,MemoryRegionCache *cache,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result)

{
  _Bool _Var1;
  MemTxResult local_5c;
  _Bool release_lock;
  ram_addr_t rStack_58;
  MemTxResult r;
  hwaddr addr1;
  hwaddr l;
  MemoryRegion *mr;
  uint64_t val;
  uint8_t *ptr;
  MemTxResult *result_local;
  hwaddr addr_local;
  MemoryRegionCache *cache_local;
  uc_struct_conflict7 *uc_local;
  MemTxAttrs attrs_local;
  
  addr1 = 1;
  ptr = (uint8_t *)result;
  result_local = (MemTxResult *)addr;
  addr_local = (hwaddr)cache;
  cache_local = (MemoryRegionCache *)uc;
  uc_local._4_4_ = attrs;
  l = (hwaddr)address_space_translate_cached(cache,addr,&stack0xffffffffffffffa8,&addr1,false,attrs)
  ;
  _Var1 = memory_access_is_direct((MemoryRegion *)l,false);
  if (_Var1) {
    val = (uint64_t)
          qemu_map_ram_ptr_mips64el
                    (*(uc_struct_conflict7 **)(l + 0x80),*(RAMBlock **)(l + 8),rStack_58);
    mr._0_4_ = ldub_p((void *)val);
    local_5c = 0;
  }
  else {
    prepare_mmio_access((MemoryRegion *)l);
    local_5c = memory_region_dispatch_read_mips64el
                         ((uc_struct_conflict7 *)cache_local,(MemoryRegion *)l,rStack_58,
                          (uint64_t *)&mr,MO_8,uc_local._4_4_);
  }
  if (ptr != (uint8_t *)0x0) {
    *(MemTxResult *)ptr = local_5c;
  }
  return (uint32_t)mr;
}

Assistant:

uint32_t glue(address_space_ldub, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result)
{
    uint8_t *ptr;
    uint64_t val;
    MemoryRegion *mr;
    hwaddr l = 1;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, false, attrs);
    if (!memory_access_is_direct(mr, false)) {
        release_lock |= prepare_mmio_access(mr);

        /* I/O case */
        r = memory_region_dispatch_read(uc, mr, addr1, &val, MO_8, attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        val = ldub_p(ptr);
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
    return val;
}